

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QVariant>::reallocateAndGrow
          (QArrayDataPointer<QVariant> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QVariant> *old)

{
  undefined8 *puVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  QVariant *pQVar4;
  bool bVar5;
  PrivateShared *pPVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  qsizetype qVar10;
  QVariant *pQVar11;
  QVariant *pQVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  QArrayDataPointer<QVariant> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QVariant> *)0x0 && where == GrowsAtEnd) {
    pQVar2 = &this->d->super_QArrayData;
    if (pQVar2 == (QArrayData *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar5)) {
      if (pQVar2 == (QArrayData *)0x0) {
        qVar10 = 0;
        lVar9 = 0;
      }
      else {
        qVar10 = pQVar2->alloc;
        lVar9 = (this->size - pQVar2->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 5);
      }
      auVar13 = QArrayData::reallocateUnaligned(pQVar2,this->ptr,0x20,qVar10 + n + lVar9,Grow);
      this->d = (Data *)auVar13._0_8_;
      this->ptr = (QVariant *)auVar13._8_8_;
      goto LAB_0010836a;
    }
  }
  local_48.size = -0x5555555555555556;
  local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.ptr = (QVariant *)0xaaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  pQVar4 = local_48.ptr;
  if (this->size != 0) {
    lVar9 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pQVar12 = this->ptr;
    pQVar11 = pQVar12 + lVar9;
    if ((old != (QArrayDataPointer<QVariant> *)0x0) || (bVar5)) {
      if ((lVar9 != 0) && (0 < lVar9)) {
        do {
          QVariant::QVariant(pQVar4 + local_48.size,pQVar12);
          pQVar12 = pQVar12 + 1;
          local_48.size = local_48.size + 1;
        } while (pQVar12 < pQVar11);
      }
    }
    else if ((lVar9 != 0) && (0 < lVar9)) {
      do {
        pPVar6 = (pQVar12->d).data.shared;
        uVar7 = *(undefined8 *)((long)&(pQVar12->d).data + 8);
        uVar8 = *(undefined8 *)&(pQVar12->d).field_0x18;
        puVar1 = (undefined8 *)((long)&local_48.ptr[local_48.size].d.data + 0x10);
        *puVar1 = *(undefined8 *)((long)&(pQVar12->d).data + 0x10);
        puVar1[1] = uVar8;
        local_48.ptr[local_48.size].d.data.shared = pPVar6;
        *(undefined8 *)((long)&local_48.ptr[local_48.size].d.data + 8) = uVar7;
        (pQVar12->d).data.shared = (PrivateShared *)0x0;
        *(undefined8 *)((long)&(pQVar12->d).data + 8) = 0;
        *(undefined8 *)((long)&(pQVar12->d).data + 0x10) = 0;
        *(undefined8 *)&(pQVar12->d).field_0x18 = 2;
        pQVar12 = pQVar12 + 1;
        local_48.size = local_48.size + 1;
      } while (pQVar12 < pQVar11);
    }
  }
  pDVar3 = this->d;
  pQVar4 = this->ptr;
  this->d = local_48.d;
  this->ptr = local_48.ptr;
  qVar10 = this->size;
  this->size = local_48.size;
  local_48.d = pDVar3;
  local_48.ptr = pQVar4;
  local_48.size = qVar10;
  if (old != (QArrayDataPointer<QVariant> *)0x0) {
    local_48.d = old->d;
    local_48.ptr = old->ptr;
    old->d = pDVar3;
    old->ptr = pQVar4;
    local_48.size = old->size;
    old->size = qVar10;
  }
  ~QArrayDataPointer(&local_48);
LAB_0010836a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }